

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigRepr.c
# Opt level: O0

Aig_Obj_t * Aig_ManDupRepr_rec(Aig_Man_t *pNew,Aig_Man_t *p,Aig_Obj_t *pObj)

{
  Aig_Obj_t *pAVar1;
  Aig_Obj_t *p1;
  Aig_Obj_t *pRepr;
  Aig_Obj_t *pObj_local;
  Aig_Man_t *p_local;
  Aig_Man_t *pNew_local;
  
  if ((pObj->field_5).pData == (void *)0x0) {
    pAVar1 = Aig_ObjFindRepr(p,pObj);
    if (pAVar1 == (Aig_Obj_t *)0x0) {
      pAVar1 = Aig_ObjFanin0(pObj);
      Aig_ManDupRepr_rec(pNew,p,pAVar1);
      pAVar1 = Aig_ObjFanin1(pObj);
      Aig_ManDupRepr_rec(pNew,p,pAVar1);
      pAVar1 = Aig_ObjChild0Repr(p,pObj);
      p1 = Aig_ObjChild1Repr(p,pObj);
      pNew_local = (Aig_Man_t *)Aig_And(pNew,pAVar1,p1);
      (pObj->field_5).pData = pNew_local;
    }
    else {
      Aig_ManDupRepr_rec(pNew,p,pAVar1);
      pNew_local = (Aig_Man_t *)
                   Aig_NotCond((Aig_Obj_t *)(pAVar1->field_5).pData,
                               (uint)(*(ulong *)&pAVar1->field_0x18 >> 3) & 1 ^
                               (uint)(*(ulong *)&pObj->field_0x18 >> 3) & 1);
      (pObj->field_5).pData = pNew_local;
    }
  }
  else {
    pNew_local = (Aig_Man_t *)(pObj->field_5).pData;
  }
  return (Aig_Obj_t *)pNew_local;
}

Assistant:

Aig_Obj_t * Aig_ManDupRepr_rec( Aig_Man_t * pNew, Aig_Man_t * p, Aig_Obj_t * pObj )
{
    Aig_Obj_t * pRepr;
    if ( pObj->pData )
        return (Aig_Obj_t *)pObj->pData;
    if ( (pRepr = Aig_ObjFindRepr(p, pObj)) )
    {
        Aig_ManDupRepr_rec( pNew, p, pRepr );
        return (Aig_Obj_t *)(pObj->pData = Aig_NotCond( (Aig_Obj_t *)pRepr->pData, pRepr->fPhase ^ pObj->fPhase ));
    }
    Aig_ManDupRepr_rec( pNew, p, Aig_ObjFanin0(pObj) );
    Aig_ManDupRepr_rec( pNew, p, Aig_ObjFanin1(pObj) );
    return (Aig_Obj_t *)(pObj->pData = Aig_And( pNew, Aig_ObjChild0Repr(p, pObj), Aig_ObjChild1Repr(p, pObj) ));
}